

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint64_t farmhash64(char *s,size_t len)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = farmhash64_te(s,len);
  uVar3 = uVar1 * -0x4b6d499041670d8d;
  uVar4 = 0x38;
  uVar5 = 0;
  uVar6 = 0x38;
  uVar2 = uVar3;
  do {
    uVar7 = 0xffL << (uVar6 & 0x3f);
    uVar8 = 0xffL << (uVar5 & 0x3f);
    uVar2 = ~(uVar7 | uVar8) & uVar2 |
            (uVar7 & uVar3) >> (uVar4 & 0x3f) | (uVar8 & uVar3) << (uVar4 & 0x3f);
    uVar6 = uVar6 - 8;
    uVar4 = uVar4 - 0x10;
    uVar5 = uVar5 + 8;
  } while (uVar6 != 0x18);
  return ~uVar2;
}

Assistant:

uint64_t farmhash64(const char* s, size_t len) {
  return debug_tweak64(
#if CAN_USE_SSE41 && CAN_USE_SSE42 && x86_64
      farmhash64_te(s, len)
#else
      farmhash64_xo(s, len)
#endif
  );
}